

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O1

int pageant_add_keyfile(Filename *filename,char *passphrase,char **retstr,_Bool add_encrypted)

{
  ptrlen pl1;
  char **ppcVar1;
  _Bool _Var2;
  int type;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  strbuf *buf_o;
  KeyList *kl;
  LoadedFile *lf;
  PageantClientOp *pPVar6;
  ssh2_userkey *key;
  char *pcVar7;
  size_t n;
  undefined7 in_register_00000009;
  PageantClientOp *pco;
  bool bVar8;
  long lVar9;
  ulong uVar10;
  ptrlen pl;
  ptrlen pl2;
  char *error;
  char *comment;
  char *local_60;
  RSAKey *local_58;
  char **local_50;
  Filename *local_48;
  char *local_40;
  char *local_38;
  
  local_60 = (char *)0x0;
  if (passphrases == (tree234 *)0x0) {
    passphrases = newtree234((cmpfn234)0x0);
  }
  *retstr = (char *)0x0;
  type = key_type(filename);
  if (type - 4U < 0xfffffffe) {
    pcVar5 = key_type_to_str(type);
    pcVar5 = dupprintf("Couldn\'t load this key (%s)",pcVar5);
    goto LAB_001147c9;
  }
  bVar8 = !add_encrypted;
  if (type == 2 && !bVar8) {
    pcVar5 = dupprintf("Can\'t add SSH-1 keys in encrypted form");
    goto LAB_001147c9;
  }
  local_38 = passphrase;
  buf_o = strbuf_new();
  local_58 = (RSAKey *)CONCAT44(local_58._4_4_,(int)CONCAT71(in_register_00000009,add_encrypted));
  if (type == 2) {
    iVar3 = rsa1_loadpub_f(filename,buf_o->binarysink_,(char **)0x0,&local_60);
    uVar4 = 1;
    if (iVar3 == 0) goto LAB_0011487d;
LAB_0011481b:
    local_48 = filename;
    kl = pageant_get_keylist(uVar4);
    if (kl == (KeyList *)0x0) {
LAB_00114911:
      iVar3 = 0;
      bVar8 = true;
      filename = local_48;
    }
    else {
      if (kl->broken == false) {
        local_50 = retstr;
        if (kl->nkeys != 0) {
          lVar9 = 0;
          uVar10 = 0;
          do {
            pl1.ptr = buf_o->u;
            pl1.len = buf_o->len;
            pl2.len = *(size_t *)((long)&(kl->keys->blob).len + lVar9);
            pl2.ptr = *(void **)((long)&(kl->keys->blob).ptr + lVar9);
            _Var2 = ptrlen_eq_ptrlen(pl1,pl2);
            if ((_Var2) &&
               ((uVar4 = *(uint *)((long)&kl->keys->flags + lVar9), (uVar4 & 2) == 0 && bVar8 ||
                ((uVar4 & 1) != 0 && !bVar8)))) {
              keylist_free(kl);
              iVar3 = 0;
              retstr = local_50;
              goto LAB_00114859;
            }
            uVar10 = uVar10 + 1;
            lVar9 = lVar9 + 0x28;
          } while (uVar10 < kl->nkeys);
        }
        keylist_free(kl);
        retstr = local_50;
        goto LAB_00114911;
      }
      pcVar5 = dupstr("Received broken key list from agent");
      *retstr = pcVar5;
      keylist_free(kl);
      iVar3 = 1;
LAB_00114859:
      bVar8 = false;
      filename = local_48;
    }
  }
  else {
    _Var2 = ppk_loadpub_f(filename,(char **)0x0,buf_o->binarysink_,(char **)0x0,&local_60);
    uVar4 = 2;
    if (_Var2) goto LAB_0011481b;
LAB_0011487d:
    bVar8 = false;
    pcVar5 = dupprintf("Couldn\'t load private key (%s)",local_60);
    *retstr = pcVar5;
    iVar3 = 1;
  }
  strbuf_free(buf_o);
  if (!bVar8) {
    return iVar3;
  }
  if ((char)local_58 == '\0') {
    local_48 = (Filename *)CONCAT44(local_48._4_4_,iVar3);
    local_60 = (char *)0x0;
    local_50 = retstr;
    if (type == 2) {
      _Var2 = rsa1_encrypted_f(filename,&local_40);
    }
    else {
      _Var2 = ppk_encrypted_f(filename,&local_40);
    }
    iVar3 = 0;
    if (type == 2) {
      local_58 = (RSAKey *)safemalloc(1,0x48,0);
    }
    else {
      local_58 = (RSAKey *)0x0;
    }
    key = (ssh2_userkey *)0x0;
    while( true ) {
      pcVar5 = "";
      if (_Var2 != false) {
        if (local_38 == (char *)0x0) {
          pcVar5 = (char *)index234(passphrases,iVar3);
        }
        else {
          pcVar5 = (char *)0x0;
          if (iVar3 == 0) {
            pcVar5 = local_38;
          }
        }
        if (pcVar5 == (char *)0x0) {
          *local_50 = local_40;
          safefree(local_58);
          return 2;
        }
      }
      if (type == 2) {
        uVar4 = rsa1_load_f(filename,local_58,pcVar5,&local_60);
      }
      else {
        key = ppk_load_f(filename,pcVar5,&local_60);
        if (key == &ssh2_wrong_passphrase) {
          uVar4 = 0xffffffff;
          key = &ssh2_wrong_passphrase;
        }
        else {
          uVar4 = (uint)((RSAKey *)key != (RSAKey *)0x0);
        }
      }
      if (uVar4 == 1) break;
      if (uVar4 == 0) {
        pcVar5 = dupstr(local_60);
        *local_50 = pcVar5;
        safefree(local_58);
        if (local_40 == (char *)0x0) {
          return 1;
        }
        safefree(local_40);
        return 1;
      }
      iVar3 = iVar3 + 1;
    }
    pcVar5 = dupstr(pcVar5);
    pcVar7 = (char *)addpos234(passphrases,pcVar5,0);
    if (pcVar7 != pcVar5) {
      n = strlen(pcVar5);
      smemclr(pcVar5,n);
      safefree(pcVar5);
    }
    ppcVar1 = local_50;
    if (local_40 != (char *)0x0) {
      safefree(local_40);
    }
    pPVar6 = pageant_client_op_new();
    if (type == 2) {
      BinarySink_put_byte(pPVar6->binarysink_,'\a');
      key = (ssh2_userkey *)local_58;
      rsa_ssh1_private_blob_agent(pPVar6->binarysink_,local_58);
      BinarySink_put_stringz(pPVar6->binarysink_,((RSAKey *)key)->comment);
      uVar4 = pageant_client_op_query(pPVar6);
      pageant_client_op_free(pPVar6);
      freersakey((RSAKey *)key);
    }
    else {
      BinarySink_put_byte(pPVar6->binarysink_,'\x11');
      BinarySink_put_stringz(pPVar6->binarysink_,*(char **)(**(long **)key + 0xa8));
      (**(code **)(**(long **)key + 0x48))(*(long **)key,pPVar6->binarysink_);
      BinarySink_put_stringz(pPVar6->binarysink_,(char *)((RSAKey *)key)->modulus);
      uVar4 = pageant_client_op_query(pPVar6);
      pageant_client_op_free(pPVar6);
      safefree(((RSAKey *)key)->modulus);
      (**(code **)(**(long **)key + 0x18))();
    }
    safefree(key);
    if (uVar4 == 6) {
      return 0;
    }
    pcVar5 = dupstr("The already running agent refused to add the key.");
    *ppcVar1 = pcVar5;
    return 1;
  }
  lf = lf_load_keyfile(filename,&local_40);
  if (lf != (LoadedFile *)0x0) {
    pPVar6 = pageant_client_op_new();
    BinarySink_put_byte(pPVar6->binarysink_,'\x1b');
    pl.len = 0x23;
    pl.ptr = "add-ppk@putty.projects.tartarus.org";
    BinarySink_put_stringpl(pPVar6->binarysink_,pl);
    BinarySink_put_string(pPVar6->binarysink_,lf->data,lf->len);
    lf_free(lf);
    uVar4 = pageant_client_op_query(pPVar6);
    pageant_client_op_free(pPVar6);
    if (uVar4 == 5) {
      local_40 = "Agent doesn\'t support adding encrypted keys";
    }
    else {
      if (uVar4 == 6) {
        return 0;
      }
      local_40 = "The already running agent refused to add the key.";
    }
  }
  pcVar5 = dupstr(local_40);
LAB_001147c9:
  *retstr = pcVar5;
  return 1;
}

Assistant:

int pageant_add_keyfile(Filename *filename, const char *passphrase,
                        char **retstr, bool add_encrypted)
{
    RSAKey *rkey = NULL;
    ssh2_userkey *skey = NULL;
    bool needs_pass;
    int ret;
    int attempts;
    char *comment;
    const char *this_passphrase;
    const char *error = NULL;
    int type;

    if (!passphrases) {
        passphrases = newtree234(NULL);
    }

    *retstr = NULL;

    type = key_type(filename);
    if (type != SSH_KEYTYPE_SSH1 && type != SSH_KEYTYPE_SSH2) {
        *retstr = dupprintf("Couldn't load this key (%s)",
                            key_type_to_str(type));
        return PAGEANT_ACTION_FAILURE;
    }

    if (add_encrypted && type == SSH_KEYTYPE_SSH1) {
        *retstr = dupprintf("Can't add SSH-1 keys in encrypted form");
        return PAGEANT_ACTION_FAILURE;
    }

    /*
     * See if the key is already loaded (in the primary Pageant,
     * which may or may not be us).
     */
    {
        strbuf *blob = strbuf_new();
        KeyList *kl;

        if (type == SSH_KEYTYPE_SSH1) {
            if (!rsa1_loadpub_f(filename, BinarySink_UPCAST(blob),
                                NULL, &error)) {
                *retstr = dupprintf("Couldn't load private key (%s)", error);
                strbuf_free(blob);
                return PAGEANT_ACTION_FAILURE;
            }
            kl = pageant_get_keylist(1);
        } else {
            if (!ppk_loadpub_f(filename, NULL, BinarySink_UPCAST(blob),
                               NULL, &error)) {
                *retstr = dupprintf("Couldn't load private key (%s)", error);
                strbuf_free(blob);
                return PAGEANT_ACTION_FAILURE;
            }
            kl = pageant_get_keylist(2);
        }

        if (kl) {
            if (kl->broken) {
                *retstr = dupstr("Received broken key list from agent");
                keylist_free(kl);
                strbuf_free(blob);
                return PAGEANT_ACTION_FAILURE;
            }

            for (size_t i = 0; i < kl->nkeys; i++) {
                /*
                 * If the key already exists in the agent, we're done,
                 * except in the following special cases:
                 *
                 * It's encrypted in the agent, and we're being asked
                 * to add it unencrypted, in which case we still want
                 * to upload the unencrypted version to cause the key
                 * to become decrypted.
                 * (Rationale: if you know in advance you're going to
                 * want it, and don't want to be interrupted at an
                 * unpredictable moment to be asked for the
                 * passphrase.)
                 *
                 * The agent only has cleartext, and we're being asked
                 * to add it encrypted, in which case we'll add the
                 * encrypted form.
                 * (Rationale: if you might want to re-encrypt the key
                 * at some future point, but it happened to have been
                 * initially added in cleartext, perhaps by something
                 * other than Pageant.)
                 */
                if (ptrlen_eq_ptrlen(ptrlen_from_strbuf(blob),
                                     kl->keys[i].blob)) {
                    bool have_unencrypted =
                        !(kl->keys[i].flags &
                          LIST_EXTENDED_FLAG_HAS_NO_CLEARTEXT_KEY);
                    bool have_encrypted =
                        (kl->keys[i].flags &
                         LIST_EXTENDED_FLAG_HAS_ENCRYPTED_KEY_FILE);
                    if ((have_unencrypted && !add_encrypted)
                        || (have_encrypted && add_encrypted)) {
                        /* Key is already present in the desired form;
                         * we can now leave. */
                        keylist_free(kl);
                        strbuf_free(blob);
                        return PAGEANT_ACTION_OK;
                    }
                }
            }

            keylist_free(kl);
        }

        strbuf_free(blob);
    }

    if (add_encrypted) {
        const char *load_error;
        LoadedFile *lf = lf_load_keyfile(filename, &load_error);
        if (!lf) {
            *retstr = dupstr(load_error);
            return PAGEANT_ACTION_FAILURE;
        }

        PageantClientOp *pco = pageant_client_op_new();
        put_byte(pco, SSH2_AGENTC_EXTENSION);
        put_stringpl(pco, extension_names[EXT_ADD_PPK]);
        put_string(pco, lf->data, lf->len);

        lf_free(lf);

        unsigned reply = pageant_client_op_query(pco);
        pageant_client_op_free(pco);

        if (reply != SSH_AGENT_SUCCESS) {
            if (reply == SSH_AGENT_FAILURE) {
                /* The agent didn't understand the protocol extension
                 * at all. */
                *retstr = dupstr("Agent doesn't support adding "
                                 "encrypted keys");
            } else {
                *retstr = dupstr("The already running agent "
                                 "refused to add the key.");
            }
            return PAGEANT_ACTION_FAILURE;
        }

        return PAGEANT_ACTION_OK;
    }

    error = NULL;
    if (type == SSH_KEYTYPE_SSH1)
        needs_pass = rsa1_encrypted_f(filename, &comment);
    else
        needs_pass = ppk_encrypted_f(filename, &comment);
    attempts = 0;
    if (type == SSH_KEYTYPE_SSH1)
        rkey = snew(RSAKey);

    /*
     * Loop round repeatedly trying to load the key, until we either
     * succeed, fail for some serious reason, or run out of
     * passphrases to try.
     */
    while (1) {
        if (needs_pass) {

            /*
             * If we've been given a passphrase on input, try using
             * it. Otherwise, try one from our tree234 of previously
             * useful passphrases.
             */
            if (passphrase) {
                this_passphrase = (attempts == 0 ? passphrase : NULL);
            } else {
                this_passphrase = (const char *)index234(passphrases, attempts);
            }

            if (!this_passphrase) {
                /*
                 * Run out of passphrases to try.
                 */
                *retstr = comment;
                sfree(rkey);
                return PAGEANT_ACTION_NEED_PP;
            }
        } else
            this_passphrase = "";

        if (type == SSH_KEYTYPE_SSH1)
            ret = rsa1_load_f(filename, rkey, this_passphrase, &error);
        else {
            skey = ppk_load_f(filename, this_passphrase, &error);
            if (skey == SSH2_WRONG_PASSPHRASE)
                ret = -1;
            else if (!skey)
                ret = 0;
            else
                ret = 1;
        }

        if (ret == 0) {
            /*
             * Failed to load the key file, for some reason other than
             * a bad passphrase.
             */
            *retstr = dupstr(error);
            sfree(rkey);
            if (comment)
                sfree(comment);
            return PAGEANT_ACTION_FAILURE;
        } else if (ret == 1) {
            /*
             * Successfully loaded the key file.
             */
            break;
        } else {
            /*
             * Passphrase wasn't right; go round again.
             */
            attempts++;
        }
    }

    /*
     * If we get here, we've successfully loaded the key into
     * rkey/skey, but not yet added it to the agent.
     */

    /*
     * If the key was successfully decrypted, save the passphrase for
     * use with other keys we try to load.
     */
    {
        char *pp_copy = dupstr(this_passphrase);
        if (addpos234(passphrases, pp_copy, 0) != pp_copy) {
            /* No need; it was already there. */
            smemclr(pp_copy, strlen(pp_copy));
            sfree(pp_copy);
        }
    }

    if (comment)
        sfree(comment);

    if (type == SSH_KEYTYPE_SSH1) {
        PageantClientOp *pco = pageant_client_op_new();
        put_byte(pco, SSH1_AGENTC_ADD_RSA_IDENTITY);
        rsa_ssh1_private_blob_agent(BinarySink_UPCAST(pco), rkey);
        put_stringz(pco, rkey->comment);
        unsigned reply = pageant_client_op_query(pco);
        pageant_client_op_free(pco);

        freersakey(rkey);
        sfree(rkey);

        if (reply != SSH_AGENT_SUCCESS) {
            *retstr = dupstr("The already running agent "
                             "refused to add the key.");
            return PAGEANT_ACTION_FAILURE;
        }
    } else {
        PageantClientOp *pco = pageant_client_op_new();
        put_byte(pco, SSH2_AGENTC_ADD_IDENTITY);
        put_stringz(pco, ssh_key_ssh_id(skey->key));
        ssh_key_openssh_blob(skey->key, BinarySink_UPCAST(pco));
        put_stringz(pco, skey->comment);
        unsigned reply = pageant_client_op_query(pco);
        pageant_client_op_free(pco);

        sfree(skey->comment);
        ssh_key_free(skey->key);
        sfree(skey);

        if (reply != SSH_AGENT_SUCCESS) {
            *retstr = dupstr("The already running agent "
                             "refused to add the key.");
            return PAGEANT_ACTION_FAILURE;
        }
    }
    return PAGEANT_ACTION_OK;
}